

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  parasail_result_t *ppVar4;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  char *__format;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  ulong local_70;
  int *local_68;
  ulong local_58;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar9 = "_s2";
  }
  else {
    local_58 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar9 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar9 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar9 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar9 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        local_70 = (ulong)(uint)matrix->length;
LAB_004fbd0b:
        iVar15 = (int)local_70;
        ppVar4 = parasail_result_new_rowcol1(iVar15,s2Len);
        if (ppVar4 == (parasail_result_t *)0x0) {
          return (parasail_result_t *)0x0;
        }
        ppVar4->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                       (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar4->flag |
                       0x1440202;
        ptr = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
        ptr_00 = parasail_memalign_int(0x10,(long)(iVar15 + 1));
        ptr_01 = parasail_memalign_int(0x10,(long)iVar15);
        ptr_02 = parasail_memalign_int(0x10,(long)(iVar15 + 1));
        auVar18._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
        auVar18._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
        auVar18._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
        auVar18._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
        iVar3 = movmskps((int)ptr_02,auVar18);
        if (iVar3 != 0) {
          return (parasail_result_t *)0x0;
        }
        if (matrix->type == 0) {
          local_68 = parasail_memalign_int(0x10,(long)iVar15);
          uVar7 = 0;
          if (local_68 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          uVar8 = 0;
          if (0 < iVar15) {
            uVar8 = local_70;
          }
          for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
            local_68[uVar7] = matrix->mapper[(byte)_s1[uVar7]];
          }
        }
        else {
          local_68 = (int *)0x0;
        }
        piVar1 = matrix->mapper;
        for (uVar7 = 0; (uint)s2Len != uVar7; uVar7 = uVar7 + 1) {
          ptr[uVar7] = piVar1[(byte)_s2[uVar7]];
        }
        *ptr_00 = 0;
        *ptr_02 = 0;
        uVar7 = 0;
        if (0 < iVar15) {
          uVar7 = local_70;
        }
        if (s1_beg == 0) {
          iVar3 = -open;
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            ptr_00[uVar8 + 1] = iVar3;
            iVar3 = iVar3 - gap;
          }
        }
        else {
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            ptr_00[uVar8 + 1] = 0;
          }
        }
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          ptr_01[uVar8] = -0x40000000;
        }
        uVar5 = s2Len - 1;
        uVar8 = (ulong)uVar5;
        uVar10 = iVar15 - 1;
        iVar15 = -0x40000000;
        for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
          for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
            iVar3 = ptr_00[uVar13 + 1] - open;
            if (ptr_00[uVar13 + 1] - open < ptr_01[uVar13] - gap) {
              iVar3 = ptr_01[uVar13] - gap;
            }
            ptr_01[uVar13] = iVar3;
          }
          for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
            if (matrix->type == 0) {
              iVar3 = local_68[uVar13];
            }
            else {
              iVar3 = (int)uVar13;
            }
            iVar3 = ptr_00[uVar13] +
                    matrix->matrix[(long)(matrix->size * iVar3) + (long)ptr[uVar12]];
            if (iVar3 <= ptr_01[uVar13]) {
              iVar3 = ptr_01[uVar13];
            }
            ptr_02[uVar13 + 1] = iVar3;
          }
          iVar3 = -((int)uVar12 * gap + open);
          if (s2_beg != 0) {
            iVar3 = 0;
          }
          *ptr_02 = iVar3;
          iVar6 = -0x40000000;
          for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
            iVar6 = iVar6 - gap;
            if (iVar6 < ptr_02[uVar13]) {
              iVar6 = ptr_02[uVar13];
            }
            iVar14 = iVar6 - open;
            if (iVar6 - open < ptr_02[uVar13 + 1]) {
              iVar14 = ptr_02[uVar13 + 1];
            }
            ptr_00[uVar13 + 1] = iVar14;
          }
          *ptr_00 = iVar3;
          iVar3 = ptr_00[(long)(int)uVar10 + 1];
          iVar6 = iVar15;
          if (s2_end != 0 && iVar15 < iVar3) {
            local_70 = (ulong)uVar10;
            iVar6 = iVar3;
          }
          ((ppVar4->field_4).rowcols)->score_row[uVar12] = iVar3;
          if (s2_end != 0 && iVar15 < iVar3) {
            local_58 = uVar12;
          }
          local_58 = local_58 & 0xffffffff;
          iVar15 = iVar6;
        }
        for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
          iVar3 = ptr_00[uVar12 + 1] - open;
          if (ptr_00[uVar12 + 1] - open < ptr_01[uVar12] - gap) {
            iVar3 = ptr_01[uVar12] - gap;
          }
          ptr_01[uVar12] = iVar3;
        }
        for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
          if (matrix->type == 0) {
            iVar3 = local_68[uVar12];
          }
          else {
            iVar3 = (int)uVar12;
          }
          iVar3 = ptr_00[uVar12] + matrix->matrix[(long)(matrix->size * iVar3) + (long)ptr[uVar8]];
          if (iVar3 <= ptr_01[uVar12]) {
            iVar3 = ptr_01[uVar12];
          }
          ptr_02[uVar12 + 1] = iVar3;
        }
        iVar3 = -(uVar5 * gap + open);
        uVar12 = 0;
        if (s2_beg != 0) {
          iVar3 = 0;
        }
        *ptr_02 = iVar3;
        iVar3 = -0x40000000;
        for (; uVar7 != uVar12; uVar12 = uVar12 + 1) {
          iVar3 = iVar3 - gap;
          if (iVar3 < ptr_02[uVar12]) {
            iVar3 = ptr_02[uVar12];
          }
          iVar6 = iVar3 - open;
          if (iVar3 - open < ptr_02[uVar12 + 1]) {
            iVar6 = ptr_02[uVar12 + 1];
          }
          ptr_00[uVar12 + 1] = iVar6;
          ((ppVar4->field_4).rowcols)->score_col[uVar12] = iVar6;
          if ((s1_end != 0) && (iVar15 < ptr_00[uVar12 + 1])) {
            local_70 = uVar12 & 0xffffffff;
            iVar15 = ptr_00[uVar12 + 1];
            local_58 = uVar8;
          }
        }
        bVar16 = s2_end != 0;
        iVar3 = ptr_00[(long)(int)uVar10 + 1];
        bVar2 = iVar15 < iVar3;
        bVar17 = s1_end == 0 && s2_end == 0;
        if (bVar17 || bVar2 && bVar16) {
          iVar15 = iVar3;
        }
        uVar11 = (uint)local_70;
        if (bVar17 || bVar2 && bVar16) {
          uVar11 = uVar10;
        }
        uVar10 = (uint)local_58;
        if (bVar17 || bVar2 && bVar16) {
          uVar10 = uVar5;
        }
        ((ppVar4->field_4).rowcols)->score_row[uVar8] = iVar3;
        ppVar4->score = iVar15;
        ppVar4->end_query = uVar11;
        ppVar4->end_ref = uVar10;
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_68);
          return ppVar4;
        }
        return ppVar4;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar9 = "_s1";
      }
      else {
        local_70 = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_004fbd0b;
        __format = "%s: %s must be > 0\n";
        pcVar9 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_rowcol_scan",pcVar9);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
#ifdef PARASAIL_ROWCOL
            result->rowcols->score_col[i] = H[i];
#endif
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}